

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O2

bool qputenv(char *varName,QByteArrayView raw)

{
  int iVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char *local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  char acStack_30 [8];
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = acStack_30;
  pcVar2 = "";
  if (raw.m_data != (char *)0x0) {
    pcVar2 = raw.m_data;
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaa;
  uStack_34 = 0xaaaaaaaa;
  acStack_30[0] = -0x56;
  acStack_30[1] = -0x56;
  acStack_30[2] = -0x56;
  acStack_30[3] = -0x56;
  acStack_30[4] = -0x56;
  acStack_30[5] = -0x56;
  acStack_30[6] = -0x56;
  acStack_30[7] = -0x56;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar2,pcVar2 + raw.m_size);
  QBasicMutex::lock(&environmentMutex);
  iVar1 = setenv(varName,local_40,1);
  QBasicMutex::unlock(&environmentMutex);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool qputenv(const char *varName, QByteArrayView raw)
{
    auto protect = [](const char *str) { return str ? str : ""; };

    std::string value{protect(raw.data()), size_t(raw.size())}; // NUL-terminates w/SSO

#if defined(Q_CC_MSVC)
    const auto locker = qt_scoped_lock(environmentMutex);
    return _putenv_s(varName, value.data()) == 0;
#elif (defined(_POSIX_VERSION) && (_POSIX_VERSION-0) >= 200112L) || defined(Q_OS_HAIKU)
    // POSIX.1-2001 has setenv
    const auto locker = qt_scoped_lock(environmentMutex);
    return setenv(varName, value.data(), true) == 0;
#else
    std::string buffer;
    buffer += protect(varName);
    buffer += '=';
    buffer += value;
    char *envVar = qstrdup(buffer.data());
    int result = [&] {
        const auto locker = qt_scoped_lock(environmentMutex);
        return putenv(envVar);
    }();
    if (result != 0) // error. we have to delete the string.
        delete[] envVar;
    return result == 0;
#endif
}